

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void idct32_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i alVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_50;
  undefined2 uStack_4e;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar31 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  undefined1 auVar32 [16];
  undefined1 auVar38 [16];
  undefined1 auVar43 [16];
  undefined1 auVar33 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar111 [16];
  undefined1 auVar118 [16];
  undefined1 auVar112 [16];
  undefined1 auVar119 [16];
  undefined1 auVar113 [16];
  undefined1 auVar120 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar151 [16];
  undefined1 auVar162 [16];
  undefined1 auVar152 [16];
  undefined1 auVar163 [16];
  undefined1 auVar153 [16];
  undefined1 auVar164 [16];
  
  auVar84 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar2 = auVar84._0_4_;
  auVar123._4_4_ = uVar2;
  auVar123._0_4_ = uVar2;
  auVar123._8_4_ = uVar2;
  auVar123._12_4_ = uVar2;
  auVar84 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar2 = auVar84._0_4_;
  auVar143._4_4_ = uVar2;
  auVar143._0_4_ = uVar2;
  auVar143._8_4_ = uVar2;
  auVar143._12_4_ = uVar2;
  auVar124 = pmulhrsw(auVar123,(undefined1  [16])input[1]);
  auVar144 = pmulhrsw(auVar143,(undefined1  [16])input[1]);
  auVar84 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar2 = auVar84._0_4_;
  auVar94._4_4_ = uVar2;
  auVar94._0_4_ = uVar2;
  auVar94._8_4_ = uVar2;
  auVar94._12_4_ = uVar2;
  auVar84 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar2 = auVar84._0_4_;
  auVar85._4_4_ = uVar2;
  auVar85._0_4_ = uVar2;
  auVar85._8_4_ = uVar2;
  auVar85._12_4_ = uVar2;
  auVar95 = pmulhrsw(auVar94,(undefined1  [16])input[7]);
  auVar86 = pmulhrsw(auVar85,(undefined1  [16])input[7]);
  auVar84 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  auVar84._4_4_ = auVar84._0_4_;
  auVar84._8_4_ = auVar84._0_4_;
  auVar84._12_4_ = auVar84._0_4_;
  auVar79 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar2 = auVar79._0_4_;
  auVar136._4_4_ = uVar2;
  auVar136._0_4_ = uVar2;
  auVar136._8_4_ = uVar2;
  auVar136._12_4_ = uVar2;
  auVar84 = pmulhrsw(auVar84,(undefined1  [16])input[5]);
  auVar137 = pmulhrsw(auVar136,(undefined1  [16])input[5]);
  auVar79 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar2 = auVar79._0_4_;
  auVar107._4_4_ = uVar2;
  auVar107._0_4_ = uVar2;
  auVar107._8_4_ = uVar2;
  auVar107._12_4_ = uVar2;
  auVar79 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  uVar2 = auVar79._0_4_;
  auVar166._4_4_ = uVar2;
  auVar166._0_4_ = uVar2;
  auVar166._8_4_ = uVar2;
  auVar166._12_4_ = uVar2;
  auVar108 = pmulhrsw(auVar107,(undefined1  [16])input[3]);
  auVar167 = pmulhrsw(auVar166,(undefined1  [16])input[3]);
  auVar79 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar2 = auVar79._0_4_;
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  auVar79 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar46._0_4_ = auVar79._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar66 = pmulhrsw(auVar65,(undefined1  [16])input[2]);
  auVar47 = pmulhrsw(auVar46,(undefined1  [16])input[2]);
  auVar79 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  uVar2 = auVar79._0_4_;
  auVar173._4_4_ = uVar2;
  auVar173._0_4_ = uVar2;
  auVar173._8_4_ = uVar2;
  auVar173._12_4_ = uVar2;
  auVar79 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  auVar18._0_4_ = auVar79._0_4_;
  auVar18._4_4_ = auVar18._0_4_;
  auVar18._8_4_ = auVar18._0_4_;
  auVar18._12_4_ = auVar18._0_4_;
  auVar174 = pmulhrsw(auVar173,(undefined1  [16])input[6]);
  auVar19 = pmulhrsw(auVar18,(undefined1  [16])input[6]);
  auVar79 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar2 = auVar79._0_4_;
  auVar20._4_4_ = uVar2;
  auVar20._0_4_ = uVar2;
  auVar20._8_4_ = uVar2;
  auVar20._12_4_ = uVar2;
  auVar79 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  auVar149._0_4_ = auVar79._0_4_;
  auVar149._4_4_ = auVar149._0_4_;
  auVar149._8_4_ = auVar149._0_4_;
  auVar149._12_4_ = auVar149._0_4_;
  auVar21 = pmulhrsw(auVar20,(undefined1  [16])input[4]);
  auVar3 = pmulhrsw(auVar149,(undefined1  [16])input[4]);
  auVar153._0_12_ = auVar124._0_12_;
  auVar153._12_2_ = auVar124._6_2_;
  auVar153._14_2_ = auVar144._6_2_;
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._0_10_ = auVar124._0_10_;
  auVar152._10_2_ = auVar144._4_2_;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._0_8_ = auVar124._0_8_;
  auVar151._8_2_ = auVar124._4_2_;
  auVar150._8_8_ = auVar151._8_8_;
  auVar150._6_2_ = auVar144._2_2_;
  auVar150._4_2_ = auVar124._2_2_;
  auVar150._0_2_ = auVar124._0_2_;
  auVar150._2_2_ = auVar144._0_2_;
  auVar109._2_2_ = auVar144._8_2_;
  auVar109._0_2_ = auVar124._8_2_;
  auVar109._4_2_ = auVar124._10_2_;
  auVar109._6_2_ = auVar144._10_2_;
  auVar109._8_2_ = auVar124._12_2_;
  auVar109._10_2_ = auVar144._12_2_;
  auVar109._12_2_ = auVar124._14_2_;
  auVar109._14_2_ = auVar144._14_2_;
  auVar7._8_4_ = 0xfb1031f;
  auVar7._0_8_ = 0xfb1031f0fb1031f;
  auVar7._12_4_ = 0xfb1031f;
  auVar154 = pmaddwd(auVar150,auVar7);
  auVar79 = pmaddwd(auVar109,auVar7);
  auVar8._8_4_ = 0x31ff04f;
  auVar8._0_8_ = 0x31ff04f031ff04f;
  auVar8._12_4_ = 0x31ff04f;
  auVar145 = pmaddwd(auVar150,auVar8);
  auVar22 = pmaddwd(auVar109,auVar8);
  auVar146._0_4_ = auVar145._0_4_ + 0x800 >> 0xc;
  auVar146._4_4_ = auVar145._4_4_ + 0x800 >> 0xc;
  auVar146._8_4_ = auVar145._8_4_ + 0x800 >> 0xc;
  auVar146._12_4_ = auVar145._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar147 = packssdw(auVar146,auVar23);
  auVar155._0_4_ = auVar154._0_4_ + 0x800 >> 0xc;
  auVar155._4_4_ = auVar154._4_4_ + 0x800 >> 0xc;
  auVar155._8_4_ = auVar154._8_4_ + 0x800 >> 0xc;
  auVar155._12_4_ = auVar154._12_4_ + 0x800 >> 0xc;
  auVar122._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar122._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar122._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar122._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar156 = packssdw(auVar155,auVar122);
  auVar4 = paddsw(auVar124,auVar95);
  auVar67 = psubsw(auVar124,auVar95);
  auVar99._0_12_ = auVar95._0_12_;
  auVar99._12_2_ = auVar95._6_2_;
  auVar99._14_2_ = auVar86._6_2_;
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._0_10_ = auVar95._0_10_;
  auVar98._10_2_ = auVar86._4_2_;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._0_8_ = auVar95._0_8_;
  auVar97._8_2_ = auVar95._4_2_;
  auVar96._8_8_ = auVar97._8_8_;
  auVar96._6_2_ = auVar86._2_2_;
  auVar96._4_2_ = auVar95._2_2_;
  auVar96._0_2_ = auVar95._0_2_;
  auVar96._2_2_ = auVar86._0_2_;
  auVar168._2_2_ = auVar86._8_2_;
  auVar168._0_2_ = auVar95._8_2_;
  auVar168._4_2_ = auVar95._10_2_;
  auVar168._6_2_ = auVar86._10_2_;
  auVar168._8_2_ = auVar95._12_2_;
  auVar168._10_2_ = auVar86._12_2_;
  auVar168._12_2_ = auVar95._14_2_;
  auVar168._14_2_ = auVar86._14_2_;
  auVar24._8_4_ = 0xf04ffce1;
  auVar24._0_8_ = 0xf04ffce1f04ffce1;
  auVar24._12_4_ = 0xf04ffce1;
  auVar124 = pmaddwd(auVar96,auVar24);
  auVar22 = pmaddwd(auVar24,auVar168);
  auVar95 = pmaddwd(auVar96,auVar8);
  auVar79 = pmaddwd(auVar168,auVar8);
  auVar125._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar125._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar125._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar125._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar126 = packssdw(auVar125,auVar25);
  auVar100._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar100._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar100._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar100._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar141._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar141._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar141._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar141._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar154 = packssdw(auVar100,auVar141);
  auVar1 = psubsw(auVar108,auVar84);
  auVar109 = paddsw(auVar108,auVar84);
  auVar22._0_12_ = auVar84._0_12_;
  auVar22._12_2_ = auVar84._6_2_;
  auVar22._14_2_ = auVar137._6_2_;
  auVar124._12_4_ = auVar22._12_4_;
  auVar124._0_10_ = auVar84._0_10_;
  auVar124._10_2_ = auVar137._4_2_;
  auVar95._10_6_ = auVar124._10_6_;
  auVar95._0_8_ = auVar84._0_8_;
  auVar95._8_2_ = auVar84._4_2_;
  auVar79._8_8_ = auVar95._8_8_;
  auVar79._6_2_ = auVar137._2_2_;
  auVar79._4_2_ = auVar84._2_2_;
  auVar79._0_2_ = auVar84._0_2_;
  auVar79._2_2_ = auVar137._0_2_;
  auVar26._2_2_ = auVar137._8_2_;
  auVar26._0_2_ = auVar84._8_2_;
  auVar26._4_2_ = auVar84._10_2_;
  auVar26._6_2_ = auVar137._10_2_;
  auVar26._8_2_ = auVar84._12_2_;
  auVar26._10_2_ = auVar137._12_2_;
  auVar26._12_2_ = auVar84._14_2_;
  auVar26._14_2_ = auVar137._14_2_;
  auVar48._8_4_ = 0x8e40d4e;
  auVar48._0_8_ = 0x8e40d4e08e40d4e;
  auVar48._12_4_ = 0x8e40d4e;
  auVar84 = pmaddwd(auVar79,auVar48);
  auVar22 = pmaddwd(auVar26,auVar48);
  auVar49._8_4_ = 0xd4ef71c;
  auVar49._0_8_ = 0xd4ef71c0d4ef71c;
  auVar49._12_4_ = 0xd4ef71c;
  auVar79 = pmaddwd(auVar79,auVar49);
  auVar95 = pmaddwd(auVar26,auVar49);
  auVar35._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar68._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar79 = packssdw(auVar35,auVar68);
  auVar145._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar145._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar145._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar145._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar27._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar84 = packssdw(auVar145,auVar27);
  auVar90._0_12_ = auVar108._0_12_;
  auVar90._12_2_ = auVar108._6_2_;
  auVar90._14_2_ = auVar167._6_2_;
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = auVar108._0_10_;
  auVar89._10_2_ = auVar167._4_2_;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._0_8_ = auVar108._0_8_;
  auVar88._8_2_ = auVar108._4_2_;
  auVar87._8_8_ = auVar88._8_8_;
  auVar87._6_2_ = auVar167._2_2_;
  auVar87._4_2_ = auVar108._2_2_;
  auVar87._0_2_ = auVar108._0_2_;
  auVar87._2_2_ = auVar167._0_2_;
  auVar116._2_2_ = auVar167._8_2_;
  auVar116._0_2_ = auVar108._8_2_;
  auVar116._4_2_ = auVar108._10_2_;
  auVar116._6_2_ = auVar167._10_2_;
  auVar116._8_2_ = auVar108._12_2_;
  auVar116._10_2_ = auVar167._12_2_;
  auVar116._12_2_ = auVar108._14_2_;
  auVar116._14_2_ = auVar167._14_2_;
  auVar28._8_4_ = 0xf71cf2b2;
  auVar28._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar28._12_4_ = 0xf71cf2b2;
  auVar145 = pmaddwd(auVar87,auVar28);
  auVar95 = pmaddwd(auVar28,auVar116);
  auVar124 = pmaddwd(auVar87,auVar49);
  auVar22 = pmaddwd(auVar116,auVar49);
  auVar101._0_4_ = auVar145._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar145._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar145._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar145._12_4_ + 0x800 >> 0xc;
  auVar29._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar145 = packssdw(auVar101,auVar29);
  auVar91._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar135._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar124 = packssdw(auVar91,auVar135);
  local_138 = auVar47._0_2_;
  uStack_136 = auVar47._2_2_;
  uStack_134 = auVar47._4_2_;
  uStack_132 = auVar47._6_2_;
  uStack_130 = auVar47._8_2_;
  uStack_12e = auVar47._10_2_;
  uStack_12c = auVar47._12_2_;
  uStack_12a = auVar47._14_2_;
  auVar33._0_12_ = auVar66._0_12_;
  auVar33._12_2_ = auVar66._6_2_;
  auVar33._14_2_ = uStack_132;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = auVar66._0_10_;
  auVar32._10_2_ = uStack_134;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = auVar66._0_8_;
  auVar31._8_2_ = auVar66._4_2_;
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._6_2_ = uStack_136;
  auVar30._4_2_ = auVar66._2_2_;
  auVar30._0_2_ = auVar66._0_2_;
  auVar30._2_2_ = local_138;
  auVar158._2_2_ = uStack_130;
  auVar158._0_2_ = auVar66._8_2_;
  auVar158._4_2_ = auVar66._10_2_;
  auVar158._6_2_ = uStack_12e;
  auVar158._8_2_ = auVar66._12_2_;
  auVar158._10_2_ = uStack_12c;
  auVar158._12_2_ = auVar66._14_2_;
  auVar158._14_2_ = uStack_12a;
  auVar92._8_4_ = 0x61ff138;
  auVar92._0_8_ = 0x61ff138061ff138;
  auVar92._12_4_ = 0x61ff138;
  auVar95 = pmaddwd(auVar30,auVar92);
  auVar22 = pmaddwd(auVar158,auVar92);
  auVar69._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar50._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar70 = packssdw(auVar69,auVar50);
  auVar51._8_4_ = 0xec8061f;
  auVar51._0_8_ = 0xec8061f0ec8061f;
  auVar51._12_4_ = 0xec8061f;
  auVar95 = pmaddwd(auVar30,auVar51);
  auVar22 = pmaddwd(auVar158,auVar51);
  auVar34._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar172._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar172._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar172._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar172._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar35 = packssdw(auVar34,auVar172);
  auVar5 = paddsw(auVar66,auVar174);
  auVar168 = psubsw(auVar66,auVar174);
  local_1e8 = auVar19._0_2_;
  uStack_1e6 = auVar19._2_2_;
  uStack_1e4 = auVar19._4_2_;
  uStack_1e2 = auVar19._6_2_;
  uStack_1e0 = auVar19._8_2_;
  uStack_1de = auVar19._10_2_;
  uStack_1dc = auVar19._12_2_;
  uStack_1da = auVar19._14_2_;
  auVar113._0_12_ = auVar174._0_12_;
  auVar113._12_2_ = auVar174._6_2_;
  auVar113._14_2_ = uStack_1e2;
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._0_10_ = auVar174._0_10_;
  auVar112._10_2_ = uStack_1e4;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._0_8_ = auVar174._0_8_;
  auVar111._8_2_ = auVar174._4_2_;
  auVar110._8_8_ = auVar111._8_8_;
  auVar110._6_2_ = uStack_1e6;
  auVar110._4_2_ = auVar174._2_2_;
  auVar110._0_2_ = auVar174._0_2_;
  auVar110._2_2_ = local_1e8;
  auVar178._2_2_ = uStack_1e0;
  auVar178._0_2_ = auVar174._8_2_;
  auVar178._4_2_ = auVar174._10_2_;
  auVar178._6_2_ = uStack_1de;
  auVar178._8_2_ = auVar174._12_2_;
  auVar178._10_2_ = uStack_1dc;
  auVar178._12_2_ = auVar174._14_2_;
  auVar178._14_2_ = uStack_1da;
  auVar169._8_4_ = 0xf138f9e1;
  auVar169._0_8_ = 0xf138f9e1f138f9e1;
  auVar169._12_4_ = 0xf138f9e1;
  auVar95 = pmaddwd(auVar110,auVar169);
  auVar22 = pmaddwd(auVar178,auVar169);
  auVar175._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar175._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar175._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar175._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar52._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar176 = packssdw(auVar175,auVar52);
  auVar95 = pmaddwd(auVar110,auVar92);
  auVar22 = pmaddwd(auVar178,auVar92);
  auVar114._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar6._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar115 = packssdw(auVar114,auVar6);
  auVar174 = paddsw(auVar147,auVar126);
  auVar148 = psubsw(auVar147,auVar126);
  auVar127 = psubsw(auVar145,auVar79);
  auVar102 = paddsw(auVar145,auVar79);
  auVar147 = paddsw(auVar167,auVar137);
  auVar95 = psubsw(auVar167,auVar137);
  auVar167 = paddsw(auVar124,auVar84);
  auVar124 = psubsw(auVar124,auVar84);
  auVar7 = psubsw(auVar144,auVar86);
  auVar137 = paddsw(auVar86,auVar144);
  auVar149 = psubsw(auVar156,auVar154);
  auVar84 = paddsw(auVar154,auVar156);
  auVar79 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar66._0_4_ = auVar79._0_4_;
  auVar66._4_4_ = auVar66._0_4_;
  auVar66._8_4_ = auVar66._0_4_;
  auVar66._12_4_ = auVar66._0_4_;
  auVar79 = pmulhrsw(auVar66,(undefined1  [16])*input);
  auVar8 = paddsw(auVar79,auVar21);
  auVar144 = psubsw(auVar79,auVar21);
  local_128 = auVar3._0_2_;
  uStack_126 = auVar3._2_2_;
  uStack_124 = auVar3._4_2_;
  uStack_122 = auVar3._6_2_;
  uStack_120 = auVar3._8_2_;
  uStack_11e = auVar3._10_2_;
  uStack_11c = auVar3._12_2_;
  uStack_11a = auVar3._14_2_;
  auVar126._0_12_ = auVar21._0_12_;
  auVar126._12_2_ = auVar21._6_2_;
  auVar126._14_2_ = uStack_122;
  auVar108._12_4_ = auVar126._12_4_;
  auVar108._0_10_ = auVar21._0_10_;
  auVar108._10_2_ = uStack_124;
  auVar154._10_6_ = auVar108._10_6_;
  auVar154._0_8_ = auVar21._0_8_;
  auVar154._8_2_ = auVar21._4_2_;
  auVar86._8_8_ = auVar154._8_8_;
  auVar86._6_2_ = uStack_126;
  auVar86._4_2_ = auVar21._2_2_;
  auVar86._0_2_ = auVar21._0_2_;
  auVar86._2_2_ = local_128;
  auVar9._2_2_ = uStack_120;
  auVar9._0_2_ = auVar21._8_2_;
  auVar9._4_2_ = auVar21._10_2_;
  auVar9._6_2_ = uStack_11e;
  auVar9._8_2_ = auVar21._12_2_;
  auVar9._10_2_ = uStack_11c;
  auVar9._12_2_ = auVar21._14_2_;
  auVar9._14_2_ = uStack_11a;
  auVar138._8_4_ = 0xb50f4b0;
  auVar138._0_8_ = 0xb50f4b00b50f4b0;
  auVar138._12_4_ = 0xb50f4b0;
  auVar22 = pmaddwd(auVar86,auVar138);
  auVar145 = pmaddwd(auVar9,auVar138);
  auVar156._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar156._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar156._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar156._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar103._0_4_ = auVar145._0_4_ + 0x800 >> 0xc;
  auVar103._4_4_ = auVar145._4_4_ + 0x800 >> 0xc;
  auVar103._8_4_ = auVar145._8_4_ + 0x800 >> 0xc;
  auVar103._12_4_ = auVar145._12_4_ + 0x800 >> 0xc;
  auVar145 = packssdw(auVar156,auVar103);
  auVar104._8_4_ = 0xb500b50;
  auVar104._0_8_ = 0xb500b500b500b50;
  auVar104._12_4_ = 0xb500b50;
  auVar22 = pmaddwd(auVar86,auVar104);
  auVar66 = pmaddwd(auVar9,auVar104);
  auVar21._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar21,auVar10);
  auVar108 = paddsw(auVar70,auVar176);
  auVar154 = psubsw(auVar70,auVar176);
  auVar70 = psubsw(auVar47,auVar19);
  auVar176 = paddsw(auVar19,auVar47);
  auVar19 = psubsw(auVar35,auVar115);
  auVar116 = paddsw(auVar115,auVar35);
  auVar39._0_12_ = auVar148._0_12_;
  auVar39._12_2_ = auVar148._6_2_;
  auVar39._14_2_ = auVar149._6_2_;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = auVar148._0_10_;
  auVar38._10_2_ = auVar149._4_2_;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = auVar148._0_8_;
  auVar37._8_2_ = auVar148._4_2_;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._6_2_ = auVar149._2_2_;
  auVar36._4_2_ = auVar148._2_2_;
  auVar36._0_2_ = auVar148._0_2_;
  auVar36._2_2_ = auVar149._0_2_;
  auVar53._2_2_ = auVar149._8_2_;
  auVar53._0_2_ = auVar148._8_2_;
  auVar53._4_2_ = auVar148._10_2_;
  auVar53._6_2_ = auVar149._10_2_;
  auVar53._8_2_ = auVar148._12_2_;
  auVar53._10_2_ = auVar149._12_2_;
  auVar53._12_2_ = auVar148._14_2_;
  auVar53._14_2_ = auVar149._14_2_;
  auVar86 = pmaddwd(auVar36,auVar92);
  auVar66 = pmaddwd(auVar53,auVar92);
  auVar157._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar157._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar157._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar157._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar158 = packssdw(auVar157,auVar11);
  auVar66 = pmaddwd(auVar36,auVar51);
  auVar86 = pmaddwd(auVar53,auVar51);
  auVar40._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar54._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar21 = packssdw(auVar40,auVar54);
  local_58 = auVar7._0_2_;
  uStack_56 = auVar7._2_2_;
  uStack_54 = auVar7._4_2_;
  uStack_52 = auVar7._6_2_;
  uStack_50 = auVar7._8_2_;
  uStack_4e = auVar7._10_2_;
  uStack_4c = auVar7._12_2_;
  uStack_4a = auVar7._14_2_;
  auVar120._0_12_ = auVar67._0_12_;
  auVar120._12_2_ = auVar67._6_2_;
  auVar120._14_2_ = uStack_52;
  auVar119._12_4_ = auVar120._12_4_;
  auVar119._0_10_ = auVar67._0_10_;
  auVar119._10_2_ = uStack_54;
  auVar118._10_6_ = auVar119._10_6_;
  auVar118._0_8_ = auVar67._0_8_;
  auVar118._8_2_ = auVar67._4_2_;
  auVar117._8_8_ = auVar118._8_8_;
  auVar117._6_2_ = uStack_56;
  auVar117._4_2_ = auVar67._2_2_;
  auVar117._0_2_ = auVar67._0_2_;
  auVar117._2_2_ = local_58;
  auVar80._2_2_ = uStack_50;
  auVar80._0_2_ = auVar67._8_2_;
  auVar80._4_2_ = auVar67._10_2_;
  auVar80._6_2_ = uStack_4e;
  auVar80._8_2_ = auVar67._12_2_;
  auVar80._10_2_ = uStack_4c;
  auVar80._12_2_ = auVar67._14_2_;
  auVar80._14_2_ = uStack_4a;
  auVar86 = pmaddwd(auVar117,auVar51);
  auVar66 = pmaddwd(auVar80,auVar51);
  auVar7 = pmaddwd(auVar117,auVar92);
  auVar126 = pmaddwd(auVar80,auVar92);
  auVar177._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar177._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar177._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar177._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar139._0_4_ = auVar126._0_4_ + 0x800 >> 0xc;
  auVar139._4_4_ = auVar126._4_4_ + 0x800 >> 0xc;
  auVar139._8_4_ = auVar126._8_4_ + 0x800 >> 0xc;
  auVar139._12_4_ = auVar126._12_4_ + 0x800 >> 0xc;
  auVar178 = packssdw(auVar177,auVar139);
  auVar121._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar81._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar122 = packssdw(auVar121,auVar81);
  local_208 = auVar95._0_2_;
  uStack_206 = auVar95._2_2_;
  uStack_204 = auVar95._4_2_;
  uStack_202 = auVar95._6_2_;
  uStack_200 = auVar95._8_2_;
  uStack_1fe = auVar95._10_2_;
  uStack_1fc = auVar95._12_2_;
  uStack_1fa = auVar95._14_2_;
  auVar15._0_12_ = auVar1._0_12_;
  auVar15._12_2_ = auVar1._6_2_;
  auVar15._14_2_ = uStack_202;
  auVar14._12_4_ = auVar15._12_4_;
  auVar14._0_10_ = auVar1._0_10_;
  auVar14._10_2_ = uStack_204;
  auVar13._10_6_ = auVar14._10_6_;
  auVar13._0_8_ = auVar1._0_8_;
  auVar13._8_2_ = auVar1._4_2_;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._6_2_ = uStack_206;
  auVar12._4_2_ = auVar1._2_2_;
  auVar12._0_2_ = auVar1._0_2_;
  auVar12._2_2_ = local_208;
  auVar55._2_2_ = uStack_200;
  auVar55._0_2_ = auVar1._8_2_;
  auVar55._4_2_ = auVar1._10_2_;
  auVar55._6_2_ = uStack_1fe;
  auVar55._8_2_ = auVar1._12_2_;
  auVar55._10_2_ = uStack_1fc;
  auVar55._12_2_ = auVar1._14_2_;
  auVar55._14_2_ = uStack_1fa;
  auVar66 = pmaddwd(auVar12,auVar169);
  auVar95 = pmaddwd(auVar55,auVar169);
  auVar140._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar82._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar141 = packssdw(auVar140,auVar82);
  auVar95 = pmaddwd(auVar12,auVar92);
  auVar66 = pmaddwd(auVar55,auVar92);
  auVar16._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar56._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar126 = packssdw(auVar16,auVar56);
  local_1d8 = auVar124._0_2_;
  uStack_1d6 = auVar124._2_2_;
  uStack_1d4 = auVar124._4_2_;
  uStack_1d2 = auVar124._6_2_;
  uStack_1d0 = auVar124._8_2_;
  uStack_1ce = auVar124._10_2_;
  uStack_1cc = auVar124._12_2_;
  uStack_1ca = auVar124._14_2_;
  auVar60._0_12_ = auVar127._0_12_;
  auVar60._12_2_ = auVar127._6_2_;
  auVar60._14_2_ = uStack_1d2;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = auVar127._0_10_;
  auVar59._10_2_ = uStack_1d4;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = auVar127._0_8_;
  auVar58._8_2_ = auVar127._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = uStack_1d6;
  auVar57._4_2_ = auVar127._2_2_;
  auVar57._0_2_ = auVar127._0_2_;
  auVar57._2_2_ = local_1d8;
  auVar128._2_2_ = uStack_1d0;
  auVar128._0_2_ = auVar127._8_2_;
  auVar128._4_2_ = auVar127._10_2_;
  auVar128._6_2_ = uStack_1ce;
  auVar128._8_2_ = auVar127._12_2_;
  auVar128._10_2_ = uStack_1cc;
  auVar128._12_2_ = auVar127._14_2_;
  auVar128._14_2_ = uStack_1ca;
  auVar124 = pmaddwd(auVar57,auVar169);
  auVar66 = pmaddwd(auVar169,auVar128);
  auVar95 = pmaddwd(auVar57,auVar92);
  auVar86 = pmaddwd(auVar128,auVar92);
  auVar93._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar170._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar170._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar170._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar170._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar66 = packssdw(auVar93,auVar170);
  auVar61._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar129._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar129._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar129._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar129._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar61,auVar129);
  auVar35 = paddsw(auVar79,auVar3);
  auVar127 = psubsw(auVar79,auVar3);
  auVar156 = paddsw(auVar79,auVar22);
  auVar148 = psubsw(auVar79,auVar22);
  auVar22 = paddsw(auVar79,auVar145);
  auVar79 = psubsw(auVar79,auVar145);
  auVar133._0_12_ = auVar154._0_12_;
  auVar133._12_2_ = auVar154._6_2_;
  auVar133._14_2_ = auVar19._6_2_;
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar154._0_10_;
  auVar132._10_2_ = auVar19._4_2_;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._0_8_ = auVar154._0_8_;
  auVar131._8_2_ = auVar154._4_2_;
  auVar130._8_8_ = auVar131._8_8_;
  auVar130._6_2_ = auVar19._2_2_;
  auVar130._4_2_ = auVar154._2_2_;
  auVar130._0_2_ = auVar154._0_2_;
  auVar130._2_2_ = auVar19._0_2_;
  auVar71._2_2_ = auVar19._8_2_;
  auVar71._0_2_ = auVar154._8_2_;
  auVar71._4_2_ = auVar154._10_2_;
  auVar71._6_2_ = auVar19._10_2_;
  auVar71._8_2_ = auVar154._12_2_;
  auVar71._10_2_ = auVar19._12_2_;
  auVar71._12_2_ = auVar154._14_2_;
  auVar71._14_2_ = auVar19._14_2_;
  auVar124 = pmaddwd(auVar130,auVar138);
  auVar95 = pmaddwd(auVar71,auVar138);
  auVar171._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar1._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar1._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar1._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar1._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar172 = packssdw(auVar171,auVar1);
  auVar124 = pmaddwd(auVar130,auVar104);
  auVar95 = pmaddwd(auVar71,auVar104);
  auVar134._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar134._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar134._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar134._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar72._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar135 = packssdw(auVar134,auVar72);
  local_88 = auVar70._0_2_;
  uStack_86 = auVar70._2_2_;
  uStack_84 = auVar70._4_2_;
  uStack_82 = auVar70._6_2_;
  uStack_80 = auVar70._8_2_;
  uStack_7e = auVar70._10_2_;
  uStack_7c = auVar70._12_2_;
  uStack_7a = auVar70._14_2_;
  auVar70._0_12_ = auVar168._0_12_;
  auVar70._12_2_ = auVar168._6_2_;
  auVar70._14_2_ = uStack_82;
  auVar67._12_4_ = auVar70._12_4_;
  auVar67._0_10_ = auVar168._0_10_;
  auVar67._10_2_ = uStack_84;
  auVar47._10_6_ = auVar67._10_6_;
  auVar47._0_8_ = auVar168._0_8_;
  auVar47._8_2_ = auVar168._4_2_;
  auVar19._8_8_ = auVar47._8_8_;
  auVar19._6_2_ = uStack_86;
  auVar19._4_2_ = auVar168._2_2_;
  auVar19._0_2_ = auVar168._0_2_;
  auVar19._2_2_ = local_88;
  auVar105._2_2_ = uStack_80;
  auVar105._0_2_ = auVar168._8_2_;
  auVar105._4_2_ = auVar168._10_2_;
  auVar105._6_2_ = uStack_7e;
  auVar105._8_2_ = auVar168._12_2_;
  auVar105._10_2_ = uStack_7c;
  auVar105._12_2_ = auVar168._14_2_;
  auVar105._14_2_ = uStack_7a;
  auVar124 = pmaddwd(auVar19,auVar138);
  auVar95 = pmaddwd(auVar105,auVar138);
  auVar73._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar73._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar73._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar73._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar3._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar3._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar3._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar3._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar73,auVar3);
  auVar95 = pmaddwd(auVar19,auVar104);
  auVar124 = pmaddwd(auVar105,auVar104);
  auVar115._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar115._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar115._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar115._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar106._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar106._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar106._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar106._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar154 = packssdw(auVar115,auVar106);
  auVar149 = paddsw(auVar4,auVar109);
  auVar67 = psubsw(auVar4,auVar109);
  auVar168 = paddsw(auVar174,auVar102);
  auVar95 = psubsw(auVar174,auVar102);
  auVar124 = paddsw(auVar158,auVar66);
  auVar102 = psubsw(auVar158,auVar66);
  auVar145 = paddsw(auVar178,auVar141);
  auVar115 = psubsw(auVar178,auVar141);
  auVar4 = psubsw(auVar137,auVar147);
  auVar66 = paddsw(auVar137,auVar147);
  auVar174 = psubsw(auVar84,auVar167);
  auVar84 = paddsw(auVar84,auVar167);
  auVar86 = psubsw(auVar21,auVar7);
  auVar21 = paddsw(auVar7,auVar21);
  auVar137 = psubsw(auVar122,auVar126);
  auVar126 = paddsw(auVar126,auVar122);
  auVar122 = paddsw(auVar35,auVar176);
  auVar1 = psubsw(auVar35,auVar176);
  auVar141 = paddsw(auVar156,auVar116);
  auVar3 = psubsw(auVar156,auVar116);
  auVar109 = paddsw(auVar22,auVar135);
  auVar7 = psubsw(auVar22,auVar135);
  auVar116 = paddsw(auVar8,auVar154);
  auVar8 = psubsw(auVar8,auVar154);
  auVar35 = paddsw(auVar144,auVar47);
  auVar22 = psubsw(auVar144,auVar47);
  auVar156 = paddsw(auVar79,auVar172);
  auVar154 = psubsw(auVar79,auVar172);
  auVar135 = paddsw(auVar148,auVar108);
  auVar108 = psubsw(auVar148,auVar108);
  auVar70 = paddsw(auVar127,auVar5);
  auVar19 = psubsw(auVar127,auVar5);
  auVar77._0_12_ = auVar115._0_12_;
  auVar77._12_2_ = auVar115._6_2_;
  auVar77._14_2_ = auVar137._6_2_;
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._0_10_ = auVar115._0_10_;
  auVar76._10_2_ = auVar137._4_2_;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._0_8_ = auVar115._0_8_;
  auVar75._8_2_ = auVar115._4_2_;
  auVar74._8_8_ = auVar75._8_8_;
  auVar74._6_2_ = auVar137._2_2_;
  auVar74._4_2_ = auVar115._2_2_;
  auVar74._0_2_ = auVar115._0_2_;
  auVar74._2_2_ = auVar137._0_2_;
  auVar179._2_2_ = auVar137._8_2_;
  auVar179._0_2_ = auVar115._8_2_;
  auVar179._4_2_ = auVar115._10_2_;
  auVar179._6_2_ = auVar137._10_2_;
  auVar179._8_2_ = auVar115._12_2_;
  auVar179._10_2_ = auVar137._12_2_;
  auVar179._12_2_ = auVar115._14_2_;
  auVar179._14_2_ = auVar137._14_2_;
  auVar137 = pmaddwd(auVar74,auVar138);
  auVar79 = pmaddwd(auVar179,auVar138);
  auVar17._0_4_ = auVar137._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar137._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar137._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar137._12_4_ + 0x800 >> 0xc;
  auVar127._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar127._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar127._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar127._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar47 = packssdw(auVar17,auVar127);
  auVar79 = pmaddwd(auVar74,auVar104);
  auVar137 = pmaddwd(auVar179,auVar104);
  auVar78._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar78._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar78._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar78._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar180._0_4_ = auVar137._0_4_ + 0x800 >> 0xc;
  auVar180._4_4_ = auVar137._4_4_ + 0x800 >> 0xc;
  auVar180._8_4_ = auVar137._8_4_ + 0x800 >> 0xc;
  auVar180._12_4_ = auVar137._12_4_ + 0x800 >> 0xc;
  auVar115 = packssdw(auVar78,auVar180);
  auVar44._0_12_ = auVar102._0_12_;
  auVar44._12_2_ = auVar102._6_2_;
  auVar44._14_2_ = auVar86._6_2_;
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = auVar102._0_10_;
  auVar43._10_2_ = auVar86._4_2_;
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_8_ = auVar102._0_8_;
  auVar42._8_2_ = auVar102._4_2_;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._6_2_ = auVar86._2_2_;
  auVar41._4_2_ = auVar102._2_2_;
  auVar41._0_2_ = auVar102._0_2_;
  auVar41._2_2_ = auVar86._0_2_;
  auVar159._2_2_ = auVar86._8_2_;
  auVar159._0_2_ = auVar102._8_2_;
  auVar159._4_2_ = auVar102._10_2_;
  auVar159._6_2_ = auVar86._10_2_;
  auVar159._8_2_ = auVar102._12_2_;
  auVar159._10_2_ = auVar86._12_2_;
  auVar159._12_2_ = auVar102._14_2_;
  auVar159._14_2_ = auVar86._14_2_;
  auVar86 = pmaddwd(auVar41,auVar138);
  auVar79 = pmaddwd(auVar159,auVar138);
  auVar181._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar137._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar137._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar137._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar137._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar158 = packssdw(auVar181,auVar137);
  auVar79 = pmaddwd(auVar41,auVar104);
  auVar86 = pmaddwd(auVar159,auVar104);
  auVar45._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar160._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar160._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar160._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar160._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar86 = packssdw(auVar45,auVar160);
  auVar164._0_12_ = auVar95._0_12_;
  auVar164._12_2_ = auVar95._6_2_;
  auVar164._14_2_ = auVar174._6_2_;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar95._0_10_;
  auVar163._10_2_ = auVar174._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar95._0_8_;
  auVar162._8_2_ = auVar95._4_2_;
  auVar161._8_8_ = auVar162._8_8_;
  auVar161._6_2_ = auVar174._2_2_;
  auVar161._4_2_ = auVar95._2_2_;
  auVar161._0_2_ = auVar95._0_2_;
  auVar161._2_2_ = auVar174._0_2_;
  auVar148._2_2_ = auVar174._8_2_;
  auVar148._0_2_ = auVar95._8_2_;
  auVar148._4_2_ = auVar95._10_2_;
  auVar148._6_2_ = auVar174._10_2_;
  auVar148._8_2_ = auVar95._12_2_;
  auVar148._10_2_ = auVar174._12_2_;
  auVar148._12_2_ = auVar95._14_2_;
  auVar148._14_2_ = auVar174._14_2_;
  auVar95 = pmaddwd(auVar161,auVar138);
  auVar79 = pmaddwd(auVar148,auVar138);
  auVar142._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar144._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar144._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar144._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar144._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar127 = packssdw(auVar142,auVar144);
  auVar95 = pmaddwd(auVar161,auVar104);
  auVar79 = pmaddwd(auVar148,auVar104);
  auVar165._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar165._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar165._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar165._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar102._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar102._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar102._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar102._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar148 = packssdw(auVar165,auVar102);
  local_118 = auVar4._0_2_;
  uStack_116 = auVar4._2_2_;
  uStack_114 = auVar4._4_2_;
  uStack_112 = auVar4._6_2_;
  uStack_110 = auVar4._8_2_;
  uStack_10e = auVar4._10_2_;
  uStack_10c = auVar4._12_2_;
  uStack_10a = auVar4._14_2_;
  auVar4._0_12_ = auVar67._0_12_;
  auVar4._12_2_ = auVar67._6_2_;
  auVar4._14_2_ = uStack_112;
  auVar5._12_4_ = auVar4._12_4_;
  auVar5._0_10_ = auVar67._0_10_;
  auVar5._10_2_ = uStack_114;
  auVar174._10_6_ = auVar5._10_6_;
  auVar174._0_8_ = auVar67._0_8_;
  auVar174._8_2_ = auVar67._4_2_;
  auVar147._8_8_ = auVar174._8_8_;
  auVar147._6_2_ = uStack_116;
  auVar147._4_2_ = auVar67._2_2_;
  auVar147._0_2_ = auVar67._0_2_;
  auVar147._2_2_ = local_118;
  auVar62._2_2_ = uStack_110;
  auVar62._0_2_ = auVar67._8_2_;
  auVar62._4_2_ = auVar67._10_2_;
  auVar62._6_2_ = uStack_10e;
  auVar62._8_2_ = auVar67._12_2_;
  auVar62._10_2_ = uStack_10c;
  auVar62._12_2_ = auVar67._14_2_;
  auVar62._14_2_ = uStack_10a;
  auVar95 = pmaddwd(auVar147,auVar138);
  auVar144 = pmaddwd(auVar138,auVar62);
  auVar79 = pmaddwd(auVar147,auVar104);
  auVar137 = pmaddwd(auVar62,auVar104);
  auVar176._0_4_ = auVar95._0_4_ + 0x800 >> 0xc;
  auVar176._4_4_ = auVar95._4_4_ + 0x800 >> 0xc;
  auVar176._8_4_ = auVar95._8_4_ + 0x800 >> 0xc;
  auVar176._12_4_ = auVar95._12_4_ + 0x800 >> 0xc;
  auVar83._0_4_ = auVar144._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar144._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar144._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar144._12_4_ + 0x800 >> 0xc;
  auVar95 = packssdw(auVar176,auVar83);
  auVar167._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar167._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar167._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar167._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar63._0_4_ = auVar137._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar137._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar137._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar137._12_4_ + 0x800 >> 0xc;
  auVar79 = packssdw(auVar167,auVar63);
  alVar64 = (__m128i)paddsw(auVar122,auVar66);
  *output = alVar64;
  alVar64 = (__m128i)psubsw(auVar122,auVar66);
  output[0x1f] = alVar64;
  alVar64 = (__m128i)paddsw(auVar141,auVar84);
  output[1] = alVar64;
  alVar64 = (__m128i)psubsw(auVar141,auVar84);
  output[0x1e] = alVar64;
  alVar64 = (__m128i)paddsw(auVar109,auVar21);
  output[2] = alVar64;
  alVar64 = (__m128i)psubsw(auVar109,auVar21);
  output[0x1d] = alVar64;
  alVar64 = (__m128i)paddsw(auVar116,auVar126);
  output[3] = alVar64;
  alVar64 = (__m128i)psubsw(auVar116,auVar126);
  output[0x1c] = alVar64;
  alVar64 = (__m128i)paddsw(auVar35,auVar115);
  output[4] = alVar64;
  alVar64 = (__m128i)psubsw(auVar35,auVar115);
  output[0x1b] = alVar64;
  alVar64 = (__m128i)paddsw(auVar156,auVar86);
  output[5] = alVar64;
  alVar64 = (__m128i)psubsw(auVar156,auVar86);
  output[0x1a] = alVar64;
  alVar64 = (__m128i)paddsw(auVar135,auVar148);
  output[6] = alVar64;
  alVar64 = (__m128i)psubsw(auVar135,auVar148);
  output[0x19] = alVar64;
  alVar64 = (__m128i)paddsw(auVar70,auVar79);
  output[7] = alVar64;
  alVar64 = (__m128i)psubsw(auVar70,auVar79);
  output[0x18] = alVar64;
  alVar64 = (__m128i)paddsw(auVar19,auVar95);
  output[8] = alVar64;
  alVar64 = (__m128i)psubsw(auVar19,auVar95);
  output[0x17] = alVar64;
  alVar64 = (__m128i)paddsw(auVar108,auVar127);
  output[9] = alVar64;
  alVar64 = (__m128i)psubsw(auVar108,auVar127);
  output[0x16] = alVar64;
  alVar64 = (__m128i)paddsw(auVar154,auVar158);
  output[10] = alVar64;
  alVar64 = (__m128i)psubsw(auVar154,auVar158);
  output[0x15] = alVar64;
  alVar64 = (__m128i)paddsw(auVar22,auVar47);
  output[0xb] = alVar64;
  alVar64 = (__m128i)psubsw(auVar22,auVar47);
  output[0x14] = alVar64;
  alVar64 = (__m128i)paddsw(auVar8,auVar145);
  output[0xc] = alVar64;
  alVar64 = (__m128i)psubsw(auVar8,auVar145);
  output[0x13] = alVar64;
  alVar64 = (__m128i)paddsw(auVar7,auVar124);
  output[0xd] = alVar64;
  alVar64 = (__m128i)psubsw(auVar7,auVar124);
  output[0x12] = alVar64;
  alVar64 = (__m128i)paddsw(auVar3,auVar168);
  output[0xe] = alVar64;
  alVar64 = (__m128i)psubsw(auVar3,auVar168);
  output[0x11] = alVar64;
  alVar64 = (__m128i)paddsw(auVar1,auVar149);
  output[0xf] = alVar64;
  alVar64 = (__m128i)psubsw(auVar1,auVar149);
  output[0x10] = alVar64;
  return;
}

Assistant:

static void idct32_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[4] = input[4];
  x[8] = input[2];
  x[12] = input[6];
  x[16] = input[1];
  x[20] = input[5];
  x[24] = input[3];
  x[28] = input[7];

  // stage 2
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];

  // stage 4
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);
  // stage 6
  x[3] = x[0];
  x[2] = x[1];
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}